

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::ItemSimilarityRecommender_SimilarItems::_InternalParse
          (ItemSimilarityRecommender_SimilarItems *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  int iVar2;
  Rep *pRVar3;
  bool bVar4;
  ItemSimilarityRecommender_ConnectedItem *obj;
  MessageLite *msg;
  uint uVar5;
  ulong uVar6;
  char cVar7;
  uint uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  double *p;
  pair<const_char_*,_unsigned_int> pVar9;
  pair<const_char_*,_unsigned_long> pVar10;
  double *local_38;
  
  local_38 = (double *)ptr;
  bVar4 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
  if (!bVar4) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *(byte *)local_38;
      uVar8 = (uint)bVar1;
      p = (double *)((long)local_38 + 1);
      if ((char)bVar1 < '\0') {
        uVar8 = ((uint)bVar1 + (uint)*(byte *)p * 0x80) - 0x80;
        if ((char)*(byte *)p < '\0') {
          pVar9 = google::protobuf::internal::ReadTagFallback((char *)local_38,uVar8);
          p = (double *)pVar9.first;
          uVar8 = pVar9.second;
        }
        else {
          p = (double *)((long)local_38 + 2);
        }
      }
      uVar5 = uVar8 >> 3;
      cVar7 = (char)uVar8;
      local_38 = p;
      if (uVar5 == 3) {
        if (cVar7 != '\x19') goto LAB_00325cf8;
        this->itemscoreadjustment_ = *p;
        local_38 = p + 1;
      }
      else {
        if (uVar5 == 2) {
          if (cVar7 == '\x12') {
            local_38 = (double *)((long)p + -1);
            do {
              local_38 = (double *)((long)local_38 + 1);
              pRVar3 = (this->similaritemlist_).super_RepeatedPtrFieldBase.rep_;
              if (pRVar3 == (Rep *)0x0) {
LAB_00325ca0:
                obj = google::protobuf::Arena::
                      CreateMaybeMessage<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>
                                ((this->similaritemlist_).super_RepeatedPtrFieldBase.arena_);
                msg = (MessageLite *)
                      google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                                (&(this->similaritemlist_).super_RepeatedPtrFieldBase,obj);
              }
              else {
                iVar2 = (this->similaritemlist_).super_RepeatedPtrFieldBase.current_size_;
                if (pRVar3->allocated_size <= iVar2) goto LAB_00325ca0;
                (this->similaritemlist_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
                msg = (MessageLite *)pRVar3->elements[iVar2];
              }
              local_38 = (double *)
                         google::protobuf::internal::ParseContext::ParseMessage
                                   (ctx,msg,(char *)local_38);
              if (local_38 == (double *)0x0) {
                return (char *)0x0;
              }
            } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                    (*(byte *)local_38 == 0x12));
            goto LAB_00325d2e;
          }
LAB_00325cf8:
          if ((uVar8 == 0) || ((uVar8 & 7) == 4)) {
            if (p == (double *)0x0) {
              return (char *)0x0;
            }
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar8 - 1;
            return (char *)p;
          }
          uVar6 = this_00->ptr_;
          if ((uVar6 & 1) == 0) {
            unknown = google::protobuf::internal::InternalMetadata::
                      mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
          }
          else {
            unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((uVar6 & 0xfffffffffffffffc) + 8);
          }
          local_38 = (double *)
                     google::protobuf::internal::UnknownFieldParse
                               (uVar8,unknown,(char *)local_38,ctx);
        }
        else {
          if ((uVar5 != 1) || (cVar7 != '\b')) goto LAB_00325cf8;
          uVar6 = (ulong)(char)*(byte *)p;
          local_38 = (double *)((long)p + 1);
          if (-1 < (long)uVar6) {
LAB_00325c60:
            this->itemid_ = uVar6;
            goto LAB_00325d2e;
          }
          uVar8 = ((uint)*(byte *)local_38 * 0x80 + (uint)*(byte *)p) - 0x80;
          if (-1 < (char)*(byte *)local_38) {
            uVar6 = (ulong)uVar8;
            local_38 = (double *)((long)p + 2);
            goto LAB_00325c60;
          }
          local_38 = p;
          pVar10 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar8);
          local_38 = (double *)pVar10.first;
          this->itemid_ = pVar10.second;
        }
        if (local_38 == (double *)0x0) {
          return (char *)0x0;
        }
      }
LAB_00325d2e:
      bVar4 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    } while (!bVar4);
  }
  return (char *)local_38;
}

Assistant:

const char* ItemSimilarityRecommender_SimilarItems::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // uint64 itemId = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          itemid_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated .CoreML.Specification.ItemSimilarityRecommender.ConnectedItem similarItemList = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_similaritemlist(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else
          goto handle_unusual;
        continue;
      // double itemScoreAdjustment = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 25)) {
          itemscoreadjustment_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr);
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}